

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lock.c
# Opt level: O2

int pick_lock(obj *pick,int rx,int ry,boolean explicit,boolean loot_after)

{
  undefined1 *puVar1;
  ushort uVar2;
  obj *obj;
  rm (*parVar3) [21];
  level *plVar4;
  long lVar5;
  boolean bVar6;
  char cVar7;
  schar sVar8;
  char cVar9;
  uint uVar10;
  char *pcVar11;
  uint uVar12;
  int iVar13;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int extraout_EDX_02;
  int iVar14;
  undefined8 extraout_RDX;
  char cVar15;
  uint uVar16;
  undefined1 uVar17;
  char *pcVar18;
  char cVar19;
  undefined7 in_register_00000081;
  char *pcVar20;
  int iVar21;
  long lVar22;
  vptrs *pvVar23;
  monst *pmVar24;
  int iVar25;
  coord cc;
  schar dz;
  int local_e0;
  int local_dc;
  long local_d8;
  long local_d0;
  monst *local_c8;
  char *local_c0;
  char qbuf [128];
  
  dz = '\0';
  uVar2 = pick->otyp;
  uVar16 = (uint)(short)uVar2;
  if ((xlock_4 != 0) && (xlock_2 == uVar16)) {
    if (((youmonst.data)->mflags1 >> 0xd & 1) == 0) {
      if ((xlock_1 == (obj *)0x0) || (bVar6 = can_reach_floor(), bVar6 != '\0')) {
        pcVar11 = lock_action();
        pline("You resume your attempt at %s.",pcVar11);
        set_occupation(picklock,pcVar11,0);
        return 1;
      }
      pcVar18 = "reach the";
      pcVar11 = "lock";
    }
    else {
      pcVar11 = "key";
      if (uVar2 == 0xe3) {
        pcVar11 = "pick";
      }
      pcVar18 = "card";
      if (uVar2 != 0xe4) {
        pcVar18 = pcVar11;
      }
      pcVar11 = "stethoscope";
      if (uVar2 != 0xf2) {
        pcVar11 = pcVar18;
      }
      pcVar18 = "hold the";
    }
    pline("Unfortunately, you can no longer %s %s.",pcVar18,pcVar11);
    reset_pick();
    return 0;
  }
  if (((youmonst.data)->mflags1 >> 0xd & 1) != 0) {
    pcVar11 = doname(pick);
    pcVar18 = "You can\'t hold %s -- you have no hands!";
    goto LAB_001ad7cc;
  }
  if ((0x10 < uVar2 - 0xe2) || ((0x10007U >> (uVar2 - 0xe2 & 0x1f) & 1) == 0)) {
    warning("picking lock with object %d?",(ulong)uVar16);
    return 0;
  }
  if (ry == 0 || rx == 0) {
    iVar21 = get_adjacent_loc((char *)0x0,"Invalid location!",u.ux,u.uy,&cc,&dz);
    if (iVar21 == 0) {
      return 0;
    }
    rx = (int)(byte)cc.x;
    ry = (int)CONCAT71((int7)((ulong)extraout_RDX >> 8),cc.y);
  }
  else {
    cc.x = (xchar)rx;
    cc.y = (xchar)ry;
  }
  plVar4 = level;
  iVar21 = (int)u.uy;
  cVar19 = (char)rx - u.ux;
  cVar15 = (char)uVar2;
  if (cVar19 == '\0') {
    if (uVar2 != 0xf2 && (char)ry != u.uy) goto LAB_001ad8a0;
LAB_001ad8d3:
    if (-1 < dz) {
      local_d8 = CONCAT44(local_d8._4_4_,(int)CONCAT71(in_register_00000081,loot_after));
      local_dc = ry;
      bVar6 = is_lava(level,(int)u.ux,iVar21);
      if (bVar6 != '\0') {
        pcVar11 = xname(pick);
        pcVar18 = "Doing that would probably melt your %s.";
        goto LAB_001ad7cc;
      }
      local_e0 = iVar21;
      bVar6 = is_pool(level,(int)u.ux,(int)u.uy);
      if ((bVar6 == '\0') || ((u._1052_1_ & 2) != 0)) {
        local_c8 = (monst *)0x2ac37a;
        if (uVar2 == 0xe3) {
          local_c8 = (monst *)0x2a4470;
        }
        local_c0 = "it";
        if (uVar2 == 0xe3) {
          local_c0 = "its lock";
        }
        iVar21 = 0;
        pvVar23 = (vptrs *)(level->objects[cc.x] + cc.y);
        while (obj = pvVar23->v_nexthere, obj != (obj *)0x0) {
          if ((ushort)(obj->otyp - 0xdaU) < 3) {
            bVar6 = can_reach_floor();
            if (bVar6 == '\0') {
              pcVar11 = xname(obj);
              pcVar11 = the(pcVar11);
              pcVar18 = "You can\'t reach %s from up here.";
              goto LAB_001ad7cc;
            }
            pcVar11 = "its lock";
            pmVar24 = (monst *)0x28eddc;
            if ((*(uint *)&obj->field_0x4a >> 0xe & 1) == 0) {
              pcVar11 = "it";
              pmVar24 = (monst *)"crack";
              if ((obj->otyp != 0xdc) &&
                 (pcVar11 = local_c0, pmVar24 = local_c8,
                 (*(uint *)&obj->field_0x4a >> 0xd & 1) == 0)) {
                pmVar24 = (monst *)0x289eb1;
                pcVar11 = "it";
              }
            }
            local_d0 = CONCAT44(local_d0._4_4_,iVar21 + 1);
            pcVar18 = doname(obj);
            pcVar20 = simple_typename((int)obj->otyp);
            pcVar20 = an(pcVar20);
            pcVar18 = safe_qbuf("",0x21,pcVar18,pcVar20,"a box");
            sprintf(qbuf,"There is %s here, %s %s?",pcVar18,pmVar24,pcVar11);
            cVar7 = yn_function(qbuf,"ynq",'q');
            iVar21 = (int)local_d0;
            if (cVar7 == 'n') goto LAB_001adbad;
            if (cVar7 == 'q') {
              return 0;
            }
            if ((uVar2 != 0xf2) && (obj->otyp == 0xdc)) {
              pcVar11 = "You aren\'t sure how to go about opening the safe that way.";
              goto LAB_001ad8bd;
            }
            uVar10 = *(uint *)&obj->field_0x4a;
            if ((uVar10 >> 0xd & 1) == 0 && obj->otyp == 0xdc) {
              pcVar11 = "You can\'t change the combination.";
              goto LAB_001ad8bd;
            }
            if ((uVar10 >> 0xe & 1) != 0) {
              pcVar11 = doname(pick);
              pcVar18 = "You can\'t fix its broken lock with %s.";
              goto LAB_001ad7cc;
            }
            if ((uVar2 == 0xe4) && ((uVar10 & 0x2000) == 0)) {
              pcVar11 = doname(pick);
              pcVar18 = "You can\'t do that with %s.";
              goto LAB_001ad7cc;
            }
            if (cVar15 == -0x1e) {
              sVar8 = acurr(3);
              iVar14 = sVar8 + 0x4b;
LAB_001ae1b4:
              uVar17 = (undefined1)local_d8;
              iVar21 = (int)local_d0;
            }
            else {
              if (cVar15 == -0x1d) {
                sVar8 = acurr(3);
                iVar14 = sVar8 * 4 + 0x19;
                if (urole.malenum != 0x164) {
                  iVar14 = sVar8 * 4;
                }
                goto LAB_001ae1b4;
              }
              if (cVar15 == -0xe) {
                sVar8 = acurr(3);
                iVar14 = 5;
                if (urole.malenum == 0x164) {
                  iVar14 = sVar8 * 2 + 5;
                }
                goto LAB_001ae1b4;
              }
              uVar17 = (undefined1)local_d8;
              iVar14 = 0;
              if (cVar15 == -0x1c) {
                sVar8 = acurr(3);
                iVar14 = sVar8 + 0x14;
                if (urole.malenum != 0x164) {
                  iVar14 = (int)sVar8;
                }
              }
            }
            iVar25 = iVar14 / 2;
            if ((obj->field_0x4a & 1) == 0) {
              iVar25 = iVar14;
            }
            xlock_0 = (rm *)0x0;
            cVar15 = (char)local_dc;
            cVar9 = (char)local_e0;
            xlock_1 = obj;
            xlock_2 = uVar16;
            xlock_5 = uVar17;
            if (cVar7 == 'y') goto LAB_001ae09d;
            break;
          }
LAB_001adbad:
          pvVar23 = &obj->v;
        }
        if (iVar21 != 0) {
          return 0;
        }
        pcVar11 = "There doesn\'t seem to be any sort of pickable lock here.";
      }
      else {
        pcVar11 = "The water has no lock.";
      }
      goto LAB_001ad8bd;
    }
    if (u.uprops[0x12].extrinsic == 0 && u.uprops[0x12].intrinsic == 0) {
      pcVar11 = "there";
      if ((youmonst.data)->mlet == '\x05') {
        pcVar11 = "here";
      }
    }
    else {
      pcVar11 = "here";
    }
    pcVar18 = "There isn\'t any sort of lock up %s.";
LAB_001ad7cc:
    pline(pcVar18,pcVar11);
  }
  else {
    if (uVar2 == 0xf2) goto LAB_001ad8d3;
LAB_001ad8a0:
    if ((u.utrap == 0) || (u.utraptype != 1)) {
      local_d0 = (long)(char)rx;
      lVar22 = (long)(char)ry;
      pmVar24 = level->monsters[local_d0][lVar22];
      if ((pmVar24 != (monst *)0x0) &&
         (uVar10 = *(uint *)&pmVar24->field_0x60, (uVar10 >> 9 & 1) == 0)) {
        if (pmVar24->wormno == '\0') {
          if ((viz_array[pmVar24->my][pmVar24->mx] & 2U) != 0) goto LAB_001adccf;
          if (u.uprops[0x1e].intrinsic == 0) {
            if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001adc0a;
            local_d8 = lVar22;
            if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001adc01;
          }
          else {
LAB_001adc01:
            if (ublindf == (obj *)0x0) goto LAB_001add1b;
LAB_001adc0a:
            if (ublindf->oartifact != '\x1d') goto LAB_001add1b;
          }
          if ((((u.uprops[0x40].extrinsic == 0 && u.uprops[0x40].intrinsic == 0) &&
               (((youmonst.data)->mflags3 & 0x100) == 0)) ||
              ((viz_array[pmVar24->my][pmVar24->mx] & 1U) == 0)) ||
             ((pmVar24->data->mflags3 & 0x200) == 0)) goto LAB_001add1b;
        }
        else {
          local_e0 = iVar21;
          local_dc = ry;
          local_d8 = lVar22;
          local_c8 = pmVar24;
          bVar6 = worm_known(level,pmVar24);
          lVar22 = local_d8;
          iVar21 = local_e0;
          ry = local_dc;
          if (bVar6 == '\0') goto LAB_001add1b;
          uVar10 = *(uint *)&local_c8->field_0x60;
          pmVar24 = local_c8;
        }
LAB_001adccf:
        if ((((uVar10 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
           (u.uprops[0xc].extrinsic != 0)) {
          if ((uVar10 & 0x280) == 0) goto LAB_001add03;
        }
        else if (((uVar10 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0)) {
LAB_001add03:
          if (((u._1052_1_ & 0x20) == 0) && (1 < (byte)(pmVar24->m_ap_type - 1))) {
            if ((uVar2 == 0xe4) && (((uVar10 >> 0x19 & 1) != 0 || (pmVar24->data == mons + 0x11e))))
            {
              verbalize("No checks, no credit, no problem.");
              return 0;
            }
            pcVar11 = mon_nam(pmVar24);
            pcVar18 = "I don\'t think %s would appreciate that.";
            goto LAB_001ad7cc;
          }
        }
      }
LAB_001add1b:
      lVar5 = local_d0;
      parVar3 = plVar4->locations + local_d0;
      if (plVar4->locations[local_d0][lVar22].typ != '\x17') {
        iVar21 = is_drawbridge_wall((int)cc.x,(int)cc.y);
        if (iVar21 < 0) {
          if (u.uprops[0x1e].intrinsic == 0) {
            if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001addce;
            if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001addc5;
            pcVar11 = "see";
          }
          else {
LAB_001addc5:
            if (ublindf == (obj *)0x0) {
              pcVar11 = "feel";
            }
            else {
LAB_001addce:
              pcVar11 = "feel";
              if (ublindf->oartifact == '\x1d') {
                pcVar11 = "see";
              }
            }
          }
          pcVar18 = "You %s no door there.";
          goto LAB_001ad7cc;
        }
        if (u.uprops[0x1e].intrinsic == 0) {
          if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001adda2;
          if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001add99;
          pcVar11 = "see";
        }
        else {
LAB_001add99:
          if (ublindf == (obj *)0x0) {
            pcVar11 = "feel";
          }
          else {
LAB_001adda2:
            pcVar11 = "feel";
            if (ublindf->oartifact == '\x1d') {
              pcVar11 = "see";
            }
          }
        }
        pcVar18 = "You %s no lock on the drawbridge.";
        goto LAB_001ad7cc;
      }
      uVar10 = *(uint *)&plVar4->locations[local_d0][lVar22].field_0x6;
      uVar12 = uVar10 >> 4 & 0x1f;
      if (uVar12 == 2) {
        pcVar11 = "You cannot lock an open door.";
      }
      else if (uVar12 == 1) {
        pcVar11 = "This door is broken.";
      }
      else if (uVar12 == 0) {
        pcVar11 = "This doorway has no door.";
      }
      else if ((uVar2 == 0xe4) && ((uVar10 & 0x80) == 0)) {
        pcVar11 = "You can\'t lock a door with a credit card.";
      }
      else {
        puVar1 = &level->locations[(int)cc.x][(int)cc.y].field_0x6;
        *(uint *)puVar1 = *(uint *)puVar1 | 1;
        local_e0 = iVar21;
        local_dc = ry;
        map_background(cc.x,cc.y,1);
        pcVar11 = "Unl";
        if ((plVar4->locations[lVar5][lVar22].field_0x6 & 0x80) == 0) {
          pcVar11 = "L";
        }
        pcVar20 = "";
        pcVar18 = " with ";
        if (explicit == '\0') {
          pcVar18 = "";
        }
        else {
          pcVar20 = doname(pick);
        }
        sprintf(qbuf,"%sock it%s%s?",pcVar11,pcVar18,pcVar20);
        iVar21 = 0x28c110;
        cVar7 = yn_function(qbuf,"yn",'n');
        if (cVar7 == 'n') {
          return 0;
        }
        if (cVar15 == -0x1e) {
          sVar8 = acurr(3);
          iVar14 = extraout_EDX_02;
          iVar25 = sVar8 + 0x46;
        }
        else {
          if (cVar15 == -0x1d) {
            sVar8 = acurr(3);
            iVar13 = sVar8 * 3;
            iVar25 = sVar8 * 3 + 0x1e;
            iVar14 = extraout_EDX_01;
          }
          else {
            iVar14 = extraout_EDX;
            iVar25 = 0;
            if (cVar15 != -0x1c) goto LAB_001ae051;
            sVar8 = acurr(3);
            iVar13 = sVar8 * 2;
            iVar25 = sVar8 * 2 + 0x14;
            iVar14 = extraout_EDX_00;
          }
          if (urole.malenum != 0x164) {
            iVar25 = iVar13;
          }
        }
LAB_001ae051:
        xlock_1 = (obj *)0x0;
        xlock_5 = 0;
        xlock_0 = *parVar3 + lVar22;
        iVar21 = artifact_door(level,iVar21,iVar14);
        cVar15 = (char)local_dc;
        cVar9 = (char)local_e0;
        if (iVar21 == 0) {
LAB_001ae09d:
          picklock_dy = cVar15 - cVar9;
          flags.move = '\0';
          xlock_4 = 0;
          picklock_dx = cVar19;
          xlock_2 = uVar16;
          xlock_3 = iVar25;
          pcVar11 = lock_action();
          set_occupation(picklock,pcVar11,0);
          return 1;
        }
        if (uVar2 != 0xe2) {
          iVar25 = -1;
          goto LAB_001ae09d;
        }
        pcVar11 = "Your key doesn\'t seem to fit.";
      }
    }
    else {
      pcVar11 = "You can\'t reach over the edge of the pit.";
    }
LAB_001ad8bd:
    pline(pcVar11);
  }
  return 0;
}

Assistant:

int pick_lock(struct obj *pick, int rx, int ry, boolean explicit, boolean loot_after)
{
	/* rx and ry are passed only from the use-stethoscope stuff */
	int picktyp, c, ch;
	coord cc;
	struct rm	*door;
	struct obj	*otmp;
	char qbuf[QBUFSZ];
	schar dx, dy, dz = 0;

	picktyp = pick->otyp;

	/* check whether we're resuming an interrupted previous attempt */
	if (xlock.usedtime && picktyp == xlock.picktyp) {
	    static const char no_longer[] = "Unfortunately, you can no longer %s %s.";

	    if (nohands(youmonst.data)) {
		const char *what = (picktyp == LOCK_PICK) ? "pick" : "key";
		if (picktyp == CREDIT_CARD) what = "card";
		if (picktyp == STETHOSCOPE) what = "stethoscope";
		pline(no_longer, "hold the", what);
		reset_pick();
		return 0;
	    } else if (xlock.box && !can_reach_floor()) {
		pline(no_longer, "reach the", "lock");
		reset_pick();
		return 0;
	    } else {
		const char *action = lock_action();
		pline("You resume your attempt at %s.", action);
		set_occupation(picklock, action, 0);
		return 1;
	    }
	}

	if (nohands(youmonst.data)) {
		pline("You can't hold %s -- you have no hands!", doname(pick));
		return 0;
	}

	if (picktyp != LOCK_PICK &&
		picktyp != STETHOSCOPE &&
		picktyp != CREDIT_CARD &&
		picktyp != SKELETON_KEY) {
		warning("picking lock with object %d?", picktyp);
		return 0;
	}
	ch = 0;		/* lint suppression */

	/* If this is a stethoscope, we know where we came from. */
	if (rx != 0 && ry != 0) {
	    cc.x = rx;
	    cc.y = ry;
	} else {
	    if (!get_adjacent_loc(NULL, "Invalid location!", u.ux, u.uy, &cc, &dz))
		return 0;
	}

	dx = cc.x - u.ux;
	dy = cc.y - u.uy;

	/* Very clumsy special case for this, but forcing the player to
	 * a)pply > just to open a safe, when a)pply . works in all other cases? */
	if ((cc.x == u.ux && cc.y == u.uy) || picktyp == STETHOSCOPE) {	/* pick lock on a container */
	    const char *verb;
	    boolean it;
	    int count;

	    if (dz < 0) {
		pline("There isn't any sort of lock up %s.",
		      Levitation ? "here" : "there");
		return 0;
	    } else if (is_lava(level, u.ux, u.uy)) {
		pline("Doing that would probably melt your %s.",
		      xname(pick));
		return 0;
	    } else if (is_pool(level, u.ux, u.uy) && !Underwater) {
		pline("The water has no lock.");
		return 0;
	    }

	    count = 0;
	    c = 'n';			/* in case there are no boxes here */
	    for (otmp = level->objects[cc.x][cc.y]; otmp; otmp = otmp->nexthere)
		if (Is_box(otmp)) {
		    ++count;
		    if (!can_reach_floor()) {
			pline("You can't reach %s from up here.", the(xname(otmp)));
			return 0;
		    }
		    it = 0;
		    if (otmp->obroken) verb = "fix";
		    else if (otmp->otyp == IRON_SAFE) verb = "crack", it = 1;
		    else if (!otmp->olocked) verb = "lock", it = 1;
		    else if (picktyp != LOCK_PICK) verb = "unlock", it = 1;
		    else verb = "pick";
		    sprintf(qbuf, "There is %s here, %s %s?",
			    safe_qbuf("", sizeof("There is  here, unlock its lock?"),
				      doname(otmp), an(simple_typename(otmp->otyp)), "a box"),
			    verb, it ? "it" : "its lock");

		    c = ynq(qbuf);
		    if (c == 'q') return 0;
		    if (c == 'n') continue;

		    if (otmp->otyp == IRON_SAFE && picktyp != STETHOSCOPE) {
			pline("You aren't sure how to go about opening the safe that way.");
			return 0;
		    }
		    if (!otmp->olocked && otmp->otyp == IRON_SAFE) {
			pline("You can't change the combination.");
			return 0;
		    }

		    if (otmp->obroken) {
			pline("You can't fix its broken lock with %s.", doname(pick));
			return 0;
		    }
		    else if (picktyp == CREDIT_CARD && !otmp->olocked) {
			/* credit cards are only good for unlocking */
			pline("You can't do that with %s.", doname(pick));
			return 0;
		    }
		    switch(picktyp) {
			case CREDIT_CARD:
			    ch = ACURR(A_DEX) + 20*Role_if (PM_ROGUE);
			    break;
			case LOCK_PICK:
			    ch = 4*ACURR(A_DEX) + 25*Role_if (PM_ROGUE);
			    break;
			case SKELETON_KEY:
			    ch = 75 + ACURR(A_DEX);
			    break;
			case STETHOSCOPE:
			    ch = 5 + 2*ACURR(A_DEX)*Role_if(PM_ROGUE);
			    break;
			default:	ch = 0;
		    }
		    if (otmp->cursed) ch /= 2;

		    xlock.picktyp = picktyp;
		    xlock.box = otmp;
		    xlock.door = 0;
		    xlock.loot_unlocked = loot_after;
		    break;
		}
	    if (c != 'y') {
		if (!count)
		    pline("There doesn't seem to be any sort of pickable lock here.");
		return 0;		/* decided against all boxes */
	    }
	} else {			/* pick the lock in a door */
	    struct monst *mtmp;

	    if (u.utrap && u.utraptype == TT_PIT) {
		pline("You can't reach over the edge of the pit.");
		return 0;
	    }

	    door = &level->locations[cc.x][cc.y];
	    if ((mtmp = m_at(level, cc.x, cc.y)) && canseemon(level, mtmp)
			&& mtmp->m_ap_type != M_AP_FURNITURE
			&& mtmp->m_ap_type != M_AP_OBJECT) {
		if (picktyp == CREDIT_CARD &&
		    (mtmp->isshk || mtmp->data == &mons[PM_ORACLE]))
		    verbalize("No checks, no credit, no problem.");
		else
		    pline("I don't think %s would appreciate that.", mon_nam(mtmp));
		return 0;
	    }
	    if (!IS_DOOR(door->typ)) {
		if (is_drawbridge_wall(cc.x,cc.y) >= 0)
		    pline("You %s no lock on the drawbridge.",
				Blind ? "feel" : "see");
		else
		    pline("You %s no door there.",
				Blind ? "feel" : "see");
		return 0;
	    }
	    switch (door->doormask) {
		case D_NODOOR:
		    pline("This doorway has no door.");
		    return 0;
		case D_ISOPEN:
		    pline("You cannot lock an open door.");
		    return 0;
		case D_BROKEN:
		    pline("This door is broken.");
		    return 0;
		default:
		    /* credit cards are only good for unlocking */
		    if (picktyp == CREDIT_CARD && !(door->doormask & D_LOCKED)) {
			pline("You can't lock a door with a credit card.");
			return 0;
		    }

		    /*
		     * At this point, the player knows that the door
		     * is a door, and whether it's locked, but not
		     * whether it's trapped; to do this, we set the
		     * mem_door_l flag and call map_background(),
		     * which will clear it if necessary (i.e. not a door
		     * after all).
		     */
		    level->locations[cc.x][cc.y].mem_door_l = 1;
		    map_background(cc.x, cc.y, TRUE);

		    sprintf(qbuf,"%sock it%s%s?",
			(door->doormask & D_LOCKED) ? "Unl" : "L",
			explicit ? " with " : "",
			explicit ? doname(pick) : "");

		    c = yn(qbuf);
		    if (c == 'n') return 0;

		    switch(picktyp) {
			case CREDIT_CARD:
			    ch = 2*ACURR(A_DEX) + 20*Role_if (PM_ROGUE);
			    break;
			case LOCK_PICK:
			    ch = 3*ACURR(A_DEX) + 30*Role_if (PM_ROGUE);
			    break;
			case SKELETON_KEY:
			    ch = 70 + ACURR(A_DEX);
			    break;
			default:    ch = 0;
		    }
		    xlock.door = door;
		    xlock.box = 0;
		    xlock.loot_unlocked = FALSE;

		    /* ALI - Artifact doors */
		    if (artifact_door(level, cc.x, cc.y)) {
			if (picktyp == SKELETON_KEY) {
			    pline("Your key doesn't seem to fit.");
			    return 0;
			} else {
			    /* -1 == 0% chance */
			    ch = -1;
			}
		    }
	    }
	}
	flags.move = 0;
	xlock.chance = ch;
	xlock.picktyp = picktyp;
	xlock.usedtime = 0;
	picklock_dx = dx;
	picklock_dy = dy;
	set_occupation(picklock, lock_action(), 0);
	return 1;
}